

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O0

expression * cast_to(dmr_C *C,expression *old,symbol *type)

{
  int iVar1;
  expression *peVar2;
  expression *orig;
  expression *expr;
  symbol *type_local;
  expression *old_local;
  dmr_C *C_local;
  
  warn_for_different_enum_types(C,old->pos,old->ctype,type);
  if ((old->ctype != &C->S->null_ctype) && (iVar1 = is_same_type(C,old,type), iVar1 != 0)) {
    return old;
  }
  if (*(char *)old == '\t') {
    if (((type->field_14).field_1.normal <= (old->ctype->field_14).field_1.normal) &&
       (old->op == 0x7e)) {
      old->ctype = type;
      peVar2 = cast_to(C,(old->field_5).field_3.unop,type);
      (old->field_5).field_3.unop = peVar2;
      return old;
    }
  }
  else if ((*(char *)old == '\r') &&
          (warn_for_different_enum_types(C,old->pos,old->ctype,type),
          (type->field_14).field_1.normal <= (old->ctype->field_14).field_1.normal)) {
    peVar2 = (old->field_5).field_6.right;
    iVar1 = same_cast_type(C,peVar2->ctype,type);
    if (iVar1 != 0) {
      return peVar2;
    }
    if ((*(uint *)((long)&old->ctype->field_14 + 0xc) & 0xff) ==
        (*(uint *)((long)&type->field_14 + 0xc) & 0xff)) {
      old->ctype = type;
      (old->field_5).field_4.symbol = type;
      return old;
    }
  }
  peVar2 = dmrC_alloc_expression(C,old->pos,0xd);
  *(ushort *)&peVar2->field_0x0 = *(ushort *)&peVar2->field_0x0 & 0xff | *(ushort *)old & 0xff00;
  peVar2->ctype = type;
  (peVar2->field_5).field_4.symbol = type;
  (peVar2->field_5).field_6.right = old;
  iVar1 = dmrC_is_bool_type(C->S,type);
  if (iVar1 != 0) {
    cast_to_bool(C,peVar2);
  }
  return peVar2;
}

Assistant:

static struct expression * cast_to(struct dmr_C *C, struct expression *old, struct symbol *type)
{
	struct expression *expr;

	warn_for_different_enum_types (C, old->pos, old->ctype, type);

	if (old->ctype != &C->S->null_ctype && is_same_type(C, old, type))
		return old;

	/*
	 * See if we can simplify the op. Move the cast down.
	 */
	switch (old->type) {
	case EXPR_PREOP:
		if (old->ctype->bit_size < type->bit_size)
			break;
		if (old->op == '~') {
			old->ctype = type;
			old->unop = cast_to(C, old->unop, type);
			return old;
		}
		break;

	case EXPR_IMPLIED_CAST:
		warn_for_different_enum_types(C, old->pos, old->ctype, type);

		if (old->ctype->bit_size >= type->bit_size) {
			struct expression *orig = old->cast_expression;
			if (same_cast_type(C, orig->ctype, type))
				return orig;
			if (old->ctype->bit_offset == type->bit_offset) {
				old->ctype = type;
				old->cast_type = type;
				return old;
			}
		}
		break;

	default:
		/* nothing */;
	}

	expr = dmrC_alloc_expression(C, old->pos, EXPR_IMPLIED_CAST);
	expr->flags = old->flags;
	expr->ctype = type;
	expr->cast_type = type;
	expr->cast_expression = old;

	if (dmrC_is_bool_type(C->S, type))
		cast_to_bool(C, expr);

	return expr;
}